

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-builder.h
# Opt level: O3

unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
wasm::Builder::makeElementSegment(Name name,Name table,Expression *offset,Type type)

{
  undefined8 *puVar1;
  undefined8 in_stack_00000008;
  
  puVar1 = (undefined8 *)operator_new(0x50);
  *puVar1 = 0;
  puVar1[1] = 0;
  puVar1[2] = 0;
  puVar1[3] = 0;
  puVar1[4] = 0;
  puVar1[5] = 0;
  puVar1[6] = 0;
  puVar1[7] = 0;
  puVar1[8] = 0;
  puVar1[9] = 0;
  wasm::Type::Type((Type *)(puVar1 + 6),(HeapType)0x1,Nullable);
  puVar1[7] = 0;
  puVar1[8] = 0;
  puVar1[9] = 0;
  *(undefined8 **)name.super_IString.str._M_len = puVar1;
  *puVar1 = name.super_IString.str._M_str;
  puVar1[1] = table.super_IString.str._M_len;
  puVar1[3] = table.super_IString.str._M_str;
  puVar1[4] = offset;
  puVar1[5] = type.id;
  puVar1[6] = in_stack_00000008;
  return (__uniq_ptr_data<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>,_true,_true>
          )(tuple<wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>)
           name.super_IString.str._M_len;
}

Assistant:

static std::unique_ptr<ElementSegment>
  makeElementSegment(Name name,
                     Name table,
                     Expression* offset = nullptr,
                     Type type = Type(HeapType::func, Nullable)) {
    auto seg = std::make_unique<ElementSegment>();
    seg->name = name;
    seg->table = table;
    seg->offset = offset;
    seg->type = type;
    return seg;
  }